

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

int __thiscall
asl::Array<wchar_t>::clone
          (Array<wchar_t> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  wchar_t *p;
  int n;
  Array<wchar_t> *this_local;
  Array<wchar_t> *b;
  
  p = *(wchar_t **)__fn;
  n = length((Array<wchar_t> *)__fn);
  Array(this,p,n);
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}